

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O2

void __thiscall test_argmax::initialize_tensors(test_argmax *this,ggml_context *ctx)

{
  ulong uVar1;
  ggml_tensor *tensor;
  long lVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  vector<float,_std::allocator<float>_> data;
  default_random_engine rng;
  random_device rd;
  allocator_type local_13e1;
  ggml_context *local_13e0;
  _Vector_base<float,_std::allocator<float>_> local_13d8;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_13c0;
  random_device local_13b8;
  
  std::random_device::random_device(&local_13b8);
  uVar1 = std::random_device::_M_getval();
  iVar3 = (int)((uVar1 & 0xffffffff) % 0x7fffffff);
  local_13c0._M_x = (unsigned_long)(iVar3 + (uint)(iVar3 == 0));
  local_13e0 = ctx;
  tensor = (ggml_tensor *)ggml_get_first_tensor(ctx);
  for (; tensor != (ggml_tensor *)0x0;
      tensor = (ggml_tensor *)ggml_get_next_tensor(local_13e0,tensor)) {
    if (tensor->type == GGML_TYPE_F32) {
      lVar5 = 0;
      while( true ) {
        lVar2 = ggml_nrows(tensor);
        if (lVar2 <= lVar5) break;
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)&local_13d8,tensor->ne[0],&local_13e1);
        lVar2 = tensor->ne[0];
        if (tensor->ne[0] < 1) {
          lVar2 = 0;
        }
        for (lVar4 = 0; lVar2 != lVar4; lVar4 = lVar4 + 1) {
          local_13d8._M_impl.super__Vector_impl_data._M_start[lVar4] = (float)(int)lVar4;
        }
        std::
        shuffle<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                  ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
                   local_13d8._M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
                   local_13d8._M_impl.super__Vector_impl_data._M_finish,&local_13c0);
        ggml_backend_tensor_set
                  (tensor,local_13d8._M_impl.super__Vector_impl_data._M_start,tensor->nb[1] * lVar5,
                   tensor->ne[0] << 2);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_13d8);
        lVar5 = lVar5 + 1;
      }
    }
    else {
      init_tensor_uniform(tensor,-1.0,1.0);
    }
  }
  std::random_device::~random_device(&local_13b8);
  return;
}

Assistant:

void initialize_tensors(ggml_context * ctx) override {
        std::random_device rd;
        std::default_random_engine rng(rd());
        for (ggml_tensor * t = ggml_get_first_tensor(ctx); t != NULL; t = ggml_get_next_tensor(ctx, t)) {
            if (t->type == GGML_TYPE_F32) {
                // initialize with unique values to avoid ties
                for (int64_t r = 0; r < ggml_nrows(t); r++) {
                    std::vector<float> data(t->ne[0]);
                    for (int i = 0; i < t->ne[0]; i++) {
                        data[i] = i;
                    }
                    std::shuffle(data.begin(), data.end(), rng);
                    ggml_backend_tensor_set(t, data.data(), r * t->nb[1], t->ne[0] * sizeof(float));
                }
            } else {
                init_tensor_uniform(t);
            }
        }
    }